

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::InitializeElementMatrix
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *this,TPZElementMatrix *ek,
          TPZElementMatrix *ef)

{
  int iVar1;
  TPZCompMesh *pTVar2;
  undefined4 extraout_var;
  TPZCompElSide *this_00;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  long *in_RDX;
  long *in_RSI;
  TPZBlock *in_RDI;
  uint ndof;
  int i;
  int numstate;
  TPZMaterial *mat;
  TPZInterpolationSpace *msp;
  int64_t iref;
  int numloadcases;
  int nstate;
  int64_t nref;
  int64_t neqThisConn;
  int ic;
  int numeq;
  int ncon;
  TPZCompEl *in_stack_00000110;
  TPZCompMesh *in_stack_ffffffffffffff30;
  TPZConnect *in_stack_ffffffffffffff38;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_stack_ffffffffffffff40;
  TPZCompEl *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  TPZManVector<long,_10> *in_stack_ffffffffffffff60;
  undefined1 local_88 [28];
  int local_6c;
  uint local_68;
  int local_64;
  long *local_60;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *local_58;
  int64_t local_50;
  int local_40;
  int local_3c;
  int64_t local_38;
  long local_30;
  uint local_24;
  int local_20;
  int local_1c;
  long *local_18;
  long *local_10;
  undefined4 extraout_var_02;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar2 = TPZCompEl::Mesh(in_stack_00000110);
  local_10[2] = (long)pTVar2;
  pTVar2 = TPZCompEl::Mesh(in_stack_00000110);
  local_18[2] = (long)pTVar2;
  *(undefined4 *)(local_10 + 1) = 2;
  *(undefined4 *)(local_18 + 1) = 1;
  local_1c = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x12])();
  local_20 = 0;
  for (local_24 = 0; (int)local_24 < local_1c; local_24 = local_24 + 1) {
    iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x15])(in_RDI,(ulong)local_24);
    in_stack_ffffffffffffff50 = CONCAT44(extraout_var,iVar1);
    TPZCompEl::Mesh(in_stack_00000110);
    iVar1 = TPZConnect::NDof(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_30 = (long)iVar1;
    local_20 = local_20 + iVar1;
  }
  local_38 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)((in_RDI->fBlock).fExtAlloc + 5));
  local_3c = 0;
  local_40 = InitializeElementMatrix::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff38);
  for (local_50 = 0; local_50 < local_38; local_50 = local_50 + 1) {
    this_00 = TPZVec<TPZCompElSide>::operator[]
                        ((TPZVec<TPZCompElSide> *)((in_RDI->fBlock).fExtAlloc + 5),local_50);
    in_stack_ffffffffffffff48 = TPZCompElSide::Element(this_00);
    if (in_stack_ffffffffffffff48 == (TPZCompEl *)0x0) {
      in_stack_ffffffffffffff40 =
           (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x0;
    }
    else {
      in_stack_ffffffffffffff40 =
           (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
           __dynamic_cast(in_stack_ffffffffffffff48,&TPZCompEl::typeinfo,
                          &TPZInterpolationSpace::typeinfo,0);
    }
    local_58 = in_stack_ffffffffffffff40;
    if (in_stack_ffffffffffffff40 !=
        (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x0) {
      local_60 = (long *)(*(code *)(in_stack_ffffffffffffff40->
                                   super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>
                                   )._M_impl._M_node.super__List_node_base._M_next[0xb]._M_prev)();
      iVar1 = (**(code **)(*local_60 + 0x78))();
      local_3c = iVar1 + local_3c;
    }
  }
  local_64 = local_3c;
  plVar3 = (long *)(**(code **)(*local_10 + 0x40))();
  (**(code **)(*plVar3 + 0x70))(plVar3,(long)local_20,(long)local_20);
  plVar3 = (long *)(**(code **)(*local_18 + 0x40))();
  (**(code **)(*plVar3 + 0x70))(plVar3,(long)local_20,(long)local_40);
  (**(code **)(*local_10 + 0x50))();
  TPZBlock::SetNBlocks(in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  (**(code **)(*local_18 + 0x50))();
  TPZBlock::SetNBlocks(in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  for (local_68 = 0; (int)local_68 < local_1c; local_68 = local_68 + 1) {
    iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x15])(in_RDI,(ulong)local_68);
    in_stack_ffffffffffffff38 = (TPZConnect *)CONCAT44(extraout_var_00,iVar1);
    TPZCompEl::Mesh(in_stack_00000110);
    local_6c = TPZConnect::NDof(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    (**(code **)(*local_10 + 0x50))();
    TPZBlock::Set(in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                  (int)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    (**(code **)(*local_18 + 0x50))();
    TPZBlock::Set(in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                  (int)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  TPZManVector<long,_10>::Resize(in_stack_ffffffffffffff60,(int64_t)in_RDI);
  TPZManVector<long,_10>::Resize(in_stack_ffffffffffffff60,(int64_t)in_RDI);
  for (local_68 = 0; (int)local_68 < local_1c; local_68 = local_68 + 1) {
    iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x14])(in_RDI,(ulong)local_68);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(local_10 + 3),(long)(int)local_68);
    *plVar3 = CONCAT44(extraout_var_01,iVar1);
    iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x14])(in_RDI,(ulong)local_68);
    lVar4 = CONCAT44(extraout_var_02,iVar1);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 3),(long)(int)local_68);
    *plVar3 = lVar4;
  }
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x34])(local_88);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::operator=
            (in_stack_ffffffffffffff40,
             (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
             in_stack_ffffffffffffff38);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::~list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1b45731);
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x34])(&stack0xffffffffffffff60);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::operator=
            (in_stack_ffffffffffffff40,
             (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
             in_stack_ffffffffffffff38);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::~list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1b45767);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeElementMatrix(TPZElementMatrix &ek, TPZElementMatrix &ef)
{
    ek.fMesh = Mesh();
    ef.fMesh = Mesh();
    ek.fType = TPZElementMatrix::EK;
    ef.fType = TPZElementMatrix::EF;
    const int ncon = this->NConnects();
    int numeq = 0;
    int ic;
    
    for(ic=0; ic<ncon; ic++)
    {
        int64_t neqThisConn = Connect(ic).NDof(*Mesh());
        numeq += neqThisConn;
    }
    
    int64_t nref = this->fElementVec.size();
    int nstate = 0;
    //nstate=1;
    
    const int numloadcases = [this](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(this->Material()); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
    for (int64_t iref=0; iref<nref; iref++) {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (! msp) {
            continue;
        }
        TPZMaterial *mat = msp->Material();
        nstate += mat->NStateVariables();
    }
    
    const int numstate = nstate;
    ek.Matrix().Redim(numeq,numeq);
    ef.Matrix().Redim(numeq,numloadcases);
    ek.Block().SetNBlocks(ncon);
    ef.Block().SetNBlocks(ncon);
    
    int i;
    for(i=0; i<ncon; i++){
        unsigned int ndof = Connect(i).NDof(*Mesh());
#ifdef PZDEBUG
        TPZConnect &c = Connect(i);
        if (c.NShape()*c.NState() != ndof) {
            DebugStop();
        }
#endif
        ek.Block().Set(i,ndof);
        ef.Block().Set(i,ndof);
    }
    ek.fConnect.Resize(ncon);
    ef.fConnect.Resize(ncon);
    for(i=0; i<ncon; i++){
        (ek.fConnect)[i] = ConnectIndex(i);
        (ef.fConnect)[i] = ConnectIndex(i);
    }
    ek.fOneRestraints = GetShapeRestraints();
    ef.fOneRestraints = GetShapeRestraints();
}